

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetworkXpan(Registry *this,uint64_t *aRet)

{
  Status SVar1;
  Network nwk;
  Network NStack_78;
  
  Network::Network(&NStack_78);
  SVar1 = GetCurrentNetwork(this,&NStack_78);
  if (SVar1 == kSuccess) {
    *aRet = NStack_78.mXpan;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mMlp._M_dataplus._M_p != &NStack_78.mMlp.field_2) {
    operator_delete(NStack_78.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mName._M_dataplus._M_p != &NStack_78.mName.field_2) {
    operator_delete(NStack_78.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetCurrentNetworkXpan(uint64_t &aRet)
{
    Registry::Status status;
    Network          nwk;
    VerifyOrExit(Registry::Status::kSuccess == (status = GetCurrentNetwork(nwk)));
    aRet = nwk.mXpan;
exit:
    return status;
}